

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

bool slang::subGeneral(uint64_t *dst,uint64_t *x,uint64_t *y,uint32_t len)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  calc_out_t result;
  uint32_t i;
  uint8_t borrow;
  uint32_t len_local;
  uint64_t *y_local;
  uint64_t *x_local;
  uint64_t *dst_local;
  
  bVar3 = false;
  for (result._4_4_ = 0; result._4_4_ < len; result._4_4_ = result._4_4_ + 1) {
    uVar1 = (ulong)bVar3;
    uVar2 = x[result._4_4_] - y[result._4_4_];
    bVar3 = x[result._4_4_] < y[result._4_4_] || uVar2 < uVar1;
    dst[result._4_4_] = uVar2 - uVar1;
  }
  return bVar3;
}

Assistant:

static bool subGeneral(uint64_t* dst, const uint64_t* x, const uint64_t* y, uint32_t len) {
    uint8_t borrow = 0;
    for (uint32_t i = 0; i < len; i++) {
        calc_out_t result;
        borrow = subborrow64(borrow, x[i], y[i], &result);
        dst[i] = result;
    }
    return borrow;
}